

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

int AF_AActor_SoundAlert
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  AActor *emitter;
  AActor *target_00;
  VMValue *pVVar2;
  bool bVar3;
  bool local_56;
  bool local_53;
  double local_50;
  double maxdist;
  bool splash;
  AActor *target;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x10b,
                  "int AF_AActor_SoundAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x10b,
                  "int AF_AActor_SoundAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  emitter = (AActor *)(param->field_0).field_1.a;
  local_53 = true;
  if (emitter != (AActor *)0x0) {
    local_53 = DObject::IsKindOf((DObject *)emitter,AActor::RegistrationInfo.MyClass);
  }
  if (local_53 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x10b,
                  "int AF_AActor_SoundAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x10c,
                  "int AF_AActor_SoundAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar3 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar3 = true, param[1].field_0.field_1.atag != 1)) {
    bVar3 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar3) {
    target_00 = (AActor *)param[1].field_0.field_1.a;
    local_56 = true;
    if (target_00 != (AActor *)0x0) {
      local_56 = DObject::IsKindOf((DObject *)target_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_56 != false) {
      if (numparam < 3) {
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        if ((pVVar2->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                        ,0x10d,
                        "int AF_AActor_SoundAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        iVar1 = (pVVar2->field_0).i;
      }
      else {
        if (param[2].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                        ,0x10d,
                        "int AF_AActor_SoundAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        iVar1 = param[2].field_0.i;
      }
      maxdist._7_1_ = iVar1 != 0;
      if (numparam < 4) {
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
        if ((pVVar2->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                        ,0x10e,
                        "int AF_AActor_SoundAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
        local_50 = (pVVar2->field_0).f;
      }
      else {
        if (param[3].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                        ,0x10e,
                        "int AF_AActor_SoundAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        local_50 = param[3].field_0.f;
      }
      P_NoiseAlert(target_00,emitter,maxdist._7_1_,local_50);
      return 0;
    }
    __assert_fail("target == NULL || target->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x10c,
                  "int AF_AActor_SoundAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0x10c,
                "int AF_AActor_SoundAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SoundAlert)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT(target, AActor);
	PARAM_BOOL_DEF(splash);
	PARAM_FLOAT_DEF(maxdist);
	// Note that the emitter is self, not the target of the alert! Target can be NULL.
	P_NoiseAlert(target, self, splash, maxdist);
	return 0;
}